

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

int lua_getstack(lua_State *L,int level,lua_Debug *ar)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  CallInfo *pCVar4;
  CallInfo *pCVar5;
  bool bVar6;
  
  if (level < 0) {
    uVar2 = 0;
  }
  else {
    piVar1 = *(int **)&L[-1].hookmask;
    iVar3 = *piVar1;
    *piVar1 = iVar3 + 1;
    if (iVar3 != 0) {
      __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                    ,0x79,"int lua_getstack(lua_State *, int, lua_Debug *)");
    }
    pCVar5 = L->ci;
    pCVar4 = &L->base_ci;
    bVar6 = pCVar5 != pCVar4;
    iVar3 = level;
    if (level != 0 && bVar6) {
      do {
        level = iVar3 + -1;
        pCVar5 = pCVar5->previous;
        bVar6 = pCVar5 != pCVar4;
        if (iVar3 < 2) break;
        iVar3 = level;
      } while (pCVar5 != pCVar4);
    }
    bVar6 = (bool)(level == 0 & bVar6);
    if (bVar6) {
      ar->i_ci = pCVar5;
    }
    uVar2 = (uint)bVar6;
    *piVar1 = 0;
  }
  return uVar2;
}

Assistant:

LUA_API int lua_getstack (lua_State *L, int level, lua_Debug *ar) {
  int status;
  CallInfo *ci;
  if (level < 0) return 0;  /* invalid (negative) level */
  lua_lock(L);
  for (ci = L->ci; level > 0 && ci != &L->base_ci; ci = ci->previous)
    level--;
  if (level == 0 && ci != &L->base_ci) {  /* level found? */
    status = 1;
    ar->i_ci = ci;
  }
  else status = 0;  /* no such level */
  lua_unlock(L);
  return status;
}